

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArgumentParser.h
# Opt level: O1

cmArgumentParser<(anonymous_namespace)::Result> * __thiscall
cmArgumentParser<(anonymous_namespace)::Result>::Bind
          (cmArgumentParser<(anonymous_namespace)::Result> *this,static_string_view name,
          offset_in_Result_to_subr member,ExpectAtLeast expect)

{
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_58._M_unused._M_object = operator_new(0x18);
  *(offset_in_Result_to_subr *)local_58._M_unused._0_8_ = member;
  *(offset_in_Result_to_subr *)((long)local_58._M_unused._0_8_ + 8) = 0;
  *(size_t *)((long)local_58._M_unused._0_8_ + 0x10) = expect.Count;
  pcStack_40 = std::
               _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmArgumentParser.h:239:28)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmArgumentParser.h:239:28)>
             ::_M_manager;
  ArgumentParser::Base::Bind(&this->super_Base,name.super_string_view,(KeywordAction *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  return this;
}

Assistant:

cmArgumentParser& Bind(cm::static_string_view name,
                         Continue (Result::*member)(cm::string_view),
                         ExpectAtLeast expect = { 1 })
  {
    this->Base::Bind(name, [member, expect](Instance& instance) {
      Result* result = static_cast<Result*>(instance.Result);
      instance.Bind(
        [result, member](cm::string_view arg) -> Continue {
          return (result->*member)(arg);
        },
        expect);
    });
    return *this;
  }